

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O1

pair<llvm::StringMapIterator<llbuild::ninja::Node_*>,_bool> __thiscall
llvm::StringMap<llbuild::ninja::Node_*,_llvm::MallocAllocator>::try_emplace<>
          (StringMap<llbuild::ninja::Node_*,_llvm::MallocAllocator> *this,StringRef Key)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  StringMapEntry<llbuild::ninja::Node_*> *pSVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Node_*>,_llvm::StringMapEntry<llbuild::ninja::Node_*>_>
  SVar6;
  pair<llvm::StringMapIterator<llbuild::ninja::Node_*>,_bool> pVar7;
  
  uVar2 = StringMapImpl::LookupBucketFor(&this->super_StringMapImpl,Key);
  SVar6.Ptr = (this->super_StringMapImpl).TheTable + uVar2;
  if (*SVar6.Ptr == (StringMapEntryBase *)0xfffffffffffffff8) {
    puVar1 = &(this->super_StringMapImpl).NumTombstones;
    *puVar1 = *puVar1 - 1;
  }
  else if (*SVar6.Ptr != (StringMapEntryBase *)0x0) {
    for (; (*SVar6.Ptr == (StringMapEntryBase *)0x0 ||
           (*SVar6.Ptr == (StringMapEntryBase *)0xfffffffffffffff8)); SVar6.Ptr = SVar6.Ptr + 1) {
    }
    uVar5 = 0;
    goto LAB_001438b8;
  }
  pSVar4 = StringMapEntry<llbuild::ninja::Node_*>::Create<llvm::MallocAllocator>
                     (Key,(MallocAllocator *)&this->field_0x18);
  *SVar6.Ptr = &pSVar4->super_StringMapEntryBase;
  uVar3 = (this->super_StringMapImpl).NumItems + 1;
  (this->super_StringMapImpl).NumItems = uVar3;
  if ((this->super_StringMapImpl).NumBuckets < uVar3 + (this->super_StringMapImpl).NumTombstones) {
    __assert_fail("NumItems + NumTombstones <= NumBuckets",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringMap.h"
                  ,0x196,
                  "std::pair<iterator, bool> llvm::StringMap<llbuild::ninja::Node *>::try_emplace(StringRef, ArgsTy &&...) [ValueTy = llbuild::ninja::Node *, AllocatorTy = llvm::MallocAllocator, ArgsTy = <>]"
                 );
  }
  uVar2 = StringMapImpl::RehashTable(&this->super_StringMapImpl,uVar2);
  for (SVar6.Ptr = (this->super_StringMapImpl).TheTable + uVar2;
      (*SVar6.Ptr == (StringMapEntryBase *)0x0 ||
      (*SVar6.Ptr == (StringMapEntryBase *)0xfffffffffffffff8)); SVar6.Ptr = SVar6.Ptr + 1) {
  }
  uVar5 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_001438b8:
  pVar7._8_8_ = uVar5;
  pVar7.first.
  super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Node_*>,_llvm::StringMapEntry<llbuild::ninja::Node_*>_>
  .Ptr = (StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Node_*>,_llvm::StringMapEntry<llbuild::ninja::Node_*>_>
          )(StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Node_*>,_llvm::StringMapEntry<llbuild::ninja::Node_*>_>
            )SVar6.Ptr;
  return pVar7;
}

Assistant:

std::pair<iterator, bool> try_emplace(StringRef Key, ArgsTy &&... Args) {
    unsigned BucketNo = LookupBucketFor(Key);
    StringMapEntryBase *&Bucket = TheTable[BucketNo];
    if (Bucket && Bucket != getTombstoneVal())
      return std::make_pair(iterator(TheTable + BucketNo, false),
                            false); // Already exists in map.

    if (Bucket == getTombstoneVal())
      --NumTombstones;
    Bucket = MapEntryTy::Create(Key, Allocator, std::forward<ArgsTy>(Args)...);
    ++NumItems;
    assert(NumItems + NumTombstones <= NumBuckets);

    BucketNo = RehashTable(BucketNo);
    return std::make_pair(iterator(TheTable + BucketNo, false), true);
  }